

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O3

void __thiscall
CMU462::PathTracer::PathTracer
          (PathTracer *this,size_t ns_aa,size_t max_ray_depth,size_t ns_area_light,size_t ns_diff,
          size_t ns_glsy,size_t ns_refr,size_t num_threads,HDRImageBuffer *envmap)

{
  EnvironmentLight *this_00;
  Sampler2D *pSVar1;
  Sampler3D *pSVar2;
  
  (this->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->workerThreads).super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->workerThreads).super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->workerThreads).super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->workQueue).storage.super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->workQueue).storage.super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->workQueue).storage.super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->workQueue).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->workQueue).lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->workQueue).lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->workQueue).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->workQueue).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->selectionHistory).c.
  super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->selectionHistory).c.
  super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->selectionHistory).c.
  super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->selectionHistory).c.
  super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->selectionHistory).c.
  super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->selectionHistory).c.
  super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->selectionHistory).c.
  super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->selectionHistory).c.
  super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->selectionHistory).c.
  super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->selectionHistory).c.
  super__Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->sampleBuffer).w = 0;
  (this->sampleBuffer).h = 0;
  (this->sampleBuffer).data.super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sampleBuffer).data.super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sampleBuffer).data.super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->frameBuffer).w = 0;
  (this->frameBuffer).h = 0;
  (this->frameBuffer).data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frameBuffer).data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frameBuffer).data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->timer).t0.__d.__r = 0;
  (this->timer).t1.__d.__r = 0;
  std::_Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
  ::_M_initialize_map((_Deque_base<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>
                       *)&this->selectionHistory,0);
  (this->rayLog).super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rayLog).super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rayLog).super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->state = INIT;
  this->ns_aa = ns_aa;
  this->max_ray_depth = max_ray_depth;
  this->ns_area_light = ns_area_light;
  this->ns_diff = ns_diff;
  this->ns_glsy = ns_diff;
  this->ns_refr = ns_refr;
  if (envmap == (HDRImageBuffer *)0x0) {
    this_00 = (EnvironmentLight *)0x0;
  }
  else {
    this_00 = (EnvironmentLight *)operator_new(0x10);
    StaticScene::EnvironmentLight::EnvironmentLight(this_00,envmap);
  }
  this->envLight = this_00;
  this->bvh = (BVHAccel *)0x0;
  this->scene = (Scene *)0x0;
  this->camera = (Camera *)0x0;
  pSVar1 = (Sampler2D *)operator_new(8);
  pSVar1->_vptr_Sampler2D = (_func_int **)&PTR__Sampler2D_0026c120;
  this->gridSampler = pSVar1;
  pSVar2 = (Sampler3D *)operator_new(8);
  pSVar2->_vptr_Sampler3D = (_func_int **)&PTR__Sampler3D_0026c160;
  this->hemisphereSampler = pSVar2;
  this->show_rays = true;
  this->imageTileSize = 0x20;
  this->numWorkerThreads = num_threads;
  std::vector<std::thread_*,_std::allocator<std::thread_*>_>::resize
            (&this->workerThreads,num_threads);
  this->tm_gamma = 2.2;
  this->tm_level = 1.0;
  this->tm_key = 0.18;
  this->tm_wht = 5.0;
  return;
}

Assistant:

PathTracer::PathTracer(size_t ns_aa,
      size_t max_ray_depth, size_t ns_area_light,
      size_t ns_diff, size_t ns_glsy, size_t ns_refr,
      size_t num_threads, HDRImageBuffer* envmap) {
    state = INIT,
    this->ns_aa = ns_aa;
    this->max_ray_depth = max_ray_depth;
    this->ns_area_light = ns_area_light;
    this->ns_diff = ns_diff;
    this->ns_glsy = ns_diff;
    this->ns_refr = ns_refr;

    if (envmap) {
      this->envLight = new EnvironmentLight(envmap);
    } else {
      this->envLight = NULL;
    }

    bvh = NULL;
    scene = NULL;
    camera = NULL;

    gridSampler = new UniformGridSampler2D();
    hemisphereSampler = new UniformHemisphereSampler3D();

    show_rays = true;

    imageTileSize = 32;
    numWorkerThreads = num_threads;
    workerThreads.resize(numWorkerThreads);

    tm_gamma = 2.2f;
    tm_level = 1.0f;
    tm_key = 0.18;
    tm_wht = 5.0f;

  }